

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::anon_unknown_3::PLYProperty::~PLYProperty(PLYProperty *this)

{
  if (this->value != (PLYValue *)0x0) {
    (*this->value->_vptr_PLYValue[1])();
  }
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

PLYProperty::~PLYProperty()
{
  delete value;
}